

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O3

void Gia_IsoAssignOneClass2(Gia_IsoMan_t *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  word *pwVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  int *piVar14;
  ulong uVar15;
  
  pVVar5 = p->vClasses;
  iVar13 = pVVar5->nSize;
  if (iVar13 < 1) {
    __assert_fail("Vec_IntSize(p->vClasses) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                  ,0x204,"void Gia_IsoAssignOneClass2(Gia_IsoMan_t *)");
  }
  if (iVar13 != 1) {
    piVar6 = pVVar5->pArray;
    lVar8 = 1;
    do {
      lVar11 = lVar8;
      uVar3 = piVar6[lVar11];
      if (uVar3 == 2) {
        uVar12 = lVar11 - 1;
        iVar13 = piVar6[(uint)uVar12 & 0xfffffffe];
        piVar14 = p->pUniques;
        pwVar7 = p->pStoreW;
        uVar9 = pwVar7[iVar13];
        if (piVar14[uVar9 >> 0x20] != 0) {
          __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                        ,0x20e,"void Gia_IsoAssignOneClass2(Gia_IsoMan_t *)");
        }
        iVar4 = p->nUniques;
        p->nUniques = iVar4 + 1;
        piVar14[uVar9 >> 0x20] = iVar4;
        uVar1 = p->nSingles;
        uVar2 = p->nEntries;
        p->nSingles = uVar1 + 1;
        p->nEntries = uVar2 + -1;
        uVar15 = pwVar7[(long)iVar13 + 1] >> 0x20;
        if (piVar14[uVar15] != 0) {
          __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin+1)] == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                        ,0x213,"void Gia_IsoAssignOneClass2(Gia_IsoMan_t *)");
        }
        goto LAB_006fc8e4;
      }
      lVar8 = lVar11 + 2;
    } while ((int)(lVar11 + 2) < iVar13);
    if (1 < (int)uVar3) {
      piVar14 = p->pUniques;
      uVar9 = p->pStoreW[piVar6[(int)lVar11 - 1U & 0xfffffffe]];
      uVar15 = uVar9 >> 0x20;
      if (piVar14[uVar15] != 0) {
        __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                      ,0x21a,"void Gia_IsoAssignOneClass2(Gia_IsoMan_t *)");
      }
      uVar12 = lVar11 + 1;
LAB_006fc8e4:
      iVar13 = p->nUniques;
      p->nUniques = iVar13 + 1;
      piVar14[uVar15] = iVar13;
      p->nSingles = p->nSingles + 1;
      p->nEntries = p->nEntries + -1;
      iVar13 = pVVar5->nSize + -2;
      uVar10 = (uint)uVar12;
      if ((int)uVar10 < iVar13) {
        piVar6 = pVVar5->pArray + (uVar12 & 0xffffffff);
        do {
          *(undefined8 *)piVar6 = *(undefined8 *)(piVar6 + 2);
          iVar13 = pVVar5->nSize + -2;
          uVar10 = (int)uVar12 + 2;
          uVar12 = (ulong)uVar10;
          piVar6 = piVar6 + 2;
        } while ((int)uVar10 < iVar13);
      }
      pVVar5->nSize = iVar13;
      printf("Broke ties in class %d of size %d at level %d.\n",(ulong)(uVar10 >> 1),(ulong)uVar3,
             (ulong)(uint)p->pLevels[uVar9 >> 0x20]);
      return;
    }
  }
  __assert_fail("nSize > 1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                ,0x20a,"void Gia_IsoAssignOneClass2(Gia_IsoMan_t *)");
}

Assistant:

void Gia_IsoAssignOneClass2( Gia_IsoMan_t * p )
{
    int i, iBegin = -1, nSize = -1;
    // find two variable class
    assert( Vec_IntSize(p->vClasses) > 0 );
    Vec_IntForEachEntryDouble( p->vClasses, iBegin, nSize, i )
    {
        if ( nSize == 2 )
            break;
    }
    assert( nSize > 1 );

    if ( nSize == 2 )
    {
        assert( p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0 );
        p->pUniques[Gia_IsoGetItem(p, iBegin)] = p->nUniques++;
        p->nSingles++;
        p->nEntries--;

        assert( p->pUniques[Gia_IsoGetItem(p, iBegin+1)] == 0 );
        p->pUniques[Gia_IsoGetItem(p, iBegin+1)] = p->nUniques++;
        p->nSingles++;
        p->nEntries--;
    }
    else
    {
        assert( p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0 );
        p->pUniques[Gia_IsoGetItem(p, iBegin)] = p->nUniques++;
        p->nSingles++;
        p->nEntries--;
    }

    for ( ; i < Vec_IntSize(p->vClasses) - 2; i += 2 )
    {
        p->vClasses->pArray[i+0] = p->vClasses->pArray[i+2];
        p->vClasses->pArray[i+1] = p->vClasses->pArray[i+3];
    }
    Vec_IntShrink( p->vClasses, Vec_IntSize(p->vClasses) - 2 );

    printf( "Broke ties in class %d of size %d at level %d.\n", i/2, nSize, p->pLevels[Gia_IsoGetItem(p, iBegin)] );
}